

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_allocator.cpp
# Opt level: O2

allocation_slot __thiscall
libtorrent::aux::stack_allocator::copy_string(stack_allocator *this,char *str)

{
  allocation_slot aVar1;
  int iVar2;
  size_t sVar3;
  
  aVar1.m_idx = (int)(this->m_storage).super_vector<char,_std::allocator<char>_>.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
                (int)(this->m_storage).super_vector<char,_std::allocator<char>_>.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
  sVar3 = strlen(str);
  iVar2 = (int)sVar3;
  container_wrapper<char,int,std::vector<char,std::allocator<char>>>::resize<int,void>
            ((container_wrapper<char,int,std::vector<char,std::allocator<char>>> *)this,
             aVar1.m_idx + iVar2 + 1);
  memcpy((this->m_storage).super_vector<char,_std::allocator<char>_>.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
         aVar1.m_idx,str,(long)iVar2);
  (this->m_storage).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [aVar1.m_idx + iVar2] = '\0';
  return (allocation_slot)aVar1.m_idx;
}

Assistant:

allocation_slot stack_allocator::copy_string(char const* str)
	{
		int const ret = int(m_storage.size());
		int const len = int(std::strlen(str));
		m_storage.resize(ret + len + 1);
		std::memcpy(&m_storage[ret], str, numeric_cast<std::size_t>(len));
		m_storage[ret + len] = '\0';
		return allocation_slot(ret);
	}